

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_> * __thiscall
bk_lib::pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>::
operator=(pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
          *this,pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                *other)

{
  uint n;
  Memcpy<Clasp::OutputTable::PredType> local_10;
  
  if (this != other) {
    local_10.first_ = (other->ebo_).buf;
    n = (other->ebo_).size;
    (this->ebo_).size = 0;
    pod_vector<Clasp::OutputTable::PredType,std::allocator<Clasp::OutputTable::PredType>>::
    insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::OutputTable::PredType>>
              ((pod_vector<Clasp::OutputTable::PredType,std::allocator<Clasp::OutputTable::PredType>>
                *)this,(this->ebo_).buf,n,&local_10);
  }
  return this;
}

Assistant:

pod_vector& operator=(const pod_vector& other) {
		if (this != &other) {
			assign(other.begin(), other.end());
		}
		return *this;
	}